

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O2

_Bool use_context_menu_birth(menu_conflict *current_menu,ui_event *in,ui_event *out)

{
  int iVar1;
  uint32_t uVar2;
  void *pvVar3;
  char *label_list;
  menu_conflict *m;
  byte bVar4;
  
  pvVar3 = menu_priv(current_menu);
  if (in->type != EVT_MOUSE) {
    __assert_fail("in->type == EVT_MOUSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                  ,0x298,"_Bool use_context_menu_birth(struct menu *, const ui_event *, ui_event *)"
                 );
  }
  bVar4 = (in->mouse).y - 7;
  if (1 < bVar4) goto switchD_001c7e3f_default;
  label_list = string_make("abcdefghijklmnopqrstuvwxyz");
  m = menu_dynamic_new();
  m->selections = label_list;
  menu_dynamic_add_label(m,"Show birth options",'=',0,label_list);
  if (*(char *)((long)pvVar3 + 0x10) == '\x01') {
    menu_dynamic_add_label(m,"Select one at random",'*',1,label_list);
  }
  menu_dynamic_add_label(m,"Finish with random choices",'@',2,label_list);
  menu_dynamic_add_label(m,"Quit",'q',3,label_list);
  menu_dynamic_add_label(m,"Help",'?',4,label_list);
  screen_save();
  menu_dynamic_calc_location(m,(uint)(in->mouse).x,(uint)(in->mouse).y);
  region_erase_bordered((region *)&m->boundary);
  iVar1 = menu_dynamic_select(m);
  menu_dynamic_free(m);
  string_free(label_list);
  screen_load();
  switch(iVar1) {
  case 0:
    do_cmd_options_birth();
    break;
  case 1:
    uVar2 = Rand_div(current_menu->count);
    current_menu->cursor = uVar2;
    out->type = EVT_SELECT;
    goto switchD_001c7e3f_default;
  case 2:
    finish_with_random_choices(*(birth_stage *)((long)pvVar3 + 0x14));
    *(undefined4 *)((long)pvVar3 + 0x14) = 10;
    break;
  case 3:
    quit((char *)0x0);
    goto switchD_001c7e3f_default;
  case 4:
    do_cmd_help();
    *(undefined4 *)((long)pvVar3 + 0x14) = 0;
    break;
  default:
    goto switchD_001c7e3f_default;
  }
  out->type = EVT_SWITCH;
switchD_001c7e3f_default:
  return bVar4 < 2;
}

Assistant:

static bool use_context_menu_birth(struct menu *current_menu,
		const ui_event *in, ui_event *out)
{
	enum {
		ACT_CTX_BIRTH_OPT,
		ACT_CTX_BIRTH_RAND,
		ACT_CTX_BIRTH_FINISH_RAND,
		ACT_CTX_BIRTH_QUIT,
		ACT_CTX_BIRTH_HELP
	};
	struct birthmenu_data *menu_data = menu_priv(current_menu);
	char *labels;
	struct menu *m;
	int selected;

	assert(in->type == EVT_MOUSE);
	if (in->mouse.y != QUESTION_ROW && in->mouse.y != QUESTION_ROW + 1) {
		return false;
	}

	labels = string_make(lower_case);
	m = menu_dynamic_new();

	m->selections = labels;
	menu_dynamic_add_label(m, "Show birth options", '=',
		ACT_CTX_BIRTH_OPT, labels);
	if (menu_data->allow_random) {
		menu_dynamic_add_label(m, "Select one at random", '*',
			ACT_CTX_BIRTH_RAND, labels);
	}
	menu_dynamic_add_label(m, "Finish with random choices", '@',
		ACT_CTX_BIRTH_FINISH_RAND, labels);
	menu_dynamic_add_label(m, "Quit", 'q', ACT_CTX_BIRTH_QUIT, labels);
	menu_dynamic_add_label(m, "Help", '?', ACT_CTX_BIRTH_HELP, labels);

	screen_save();

	menu_dynamic_calc_location(m, in->mouse.x, in->mouse.y);
	region_erase_bordered(&m->boundary);

	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	switch (selected) {
	case ACT_CTX_BIRTH_OPT:
		do_cmd_options_birth();
		/* The stage remains the same so leave stage_inout as is. */
		out->type = EVT_SWITCH;
		break;

	case ACT_CTX_BIRTH_RAND:
		current_menu->cursor = randint0(current_menu->count);
		out->type = EVT_SELECT;
		break;

	case ACT_CTX_BIRTH_FINISH_RAND:
		finish_with_random_choices(menu_data->stage_inout);
		menu_data->stage_inout = BIRTH_FINAL_CONFIRM;
		out->type = EVT_SWITCH;
		break;

	case ACT_CTX_BIRTH_QUIT:
		quit(NULL);
		break;

	case ACT_CTX_BIRTH_HELP:
		do_cmd_help();
		menu_data->stage_inout = BIRTH_RESET;
		out->type = EVT_SWITCH;

	default:
		/* There's nothing to do. */
		break;
	}

	return true;
}